

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

void __thiscall
el::base::TypedConfigurations::setValue<bool>
          (TypedConfigurations *this,Level level,bool *value,
          unordered_map<el::Level,_bool,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
          *confMap,bool includeGlobalLevel)

{
  byte bVar1;
  unordered_map<el::Level,bool,std::hash<el::Level>,std::equal_to<el::Level>,std::allocator<std::pair<el::Level_const,bool>>>
  *puVar2;
  bool bVar3;
  bool bVar4;
  pointer ppVar5;
  pair<el::Level,_bool> pVar6;
  mapped_type *pmVar7;
  pair<el::Level,_bool> local_78;
  _Node_iterator_base<std::pair<const_el::Level,_bool>,_true> local_70;
  _Node_iterator_base<std::pair<const_el::Level,_bool>,_true> local_68;
  _Node_iterator_base<std::pair<const_el::Level,_bool>,_true> local_60;
  key_type local_54;
  _Node_iterator_base<std::pair<const_el::Level,_bool>,_true> local_50;
  iterator it;
  Level local_38;
  pair<el::Level,_bool> local_34;
  byte local_29;
  unordered_map<el::Level,bool,std::hash<el::Level>,std::equal_to<el::Level>,std::allocator<std::pair<el::Level_const,bool>>>
  *puStack_28;
  bool includeGlobalLevel_local;
  unordered_map<el::Level,_bool,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
  *confMap_local;
  bool *value_local;
  TypedConfigurations *pTStack_10;
  Level level_local;
  TypedConfigurations *this_local;
  
  local_29 = includeGlobalLevel;
  puStack_28 = (unordered_map<el::Level,bool,std::hash<el::Level>,std::equal_to<el::Level>,std::allocator<std::pair<el::Level_const,bool>>>
                *)confMap;
  confMap_local =
       (unordered_map<el::Level,_bool,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
        *)value;
  value_local._4_4_ = level;
  pTStack_10 = this;
  bVar3 = utils::std::
          unordered_map<el::Level,_bool,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
          ::empty(confMap);
  puVar2 = puStack_28;
  if ((bVar3) && ((local_29 & 1) != 0)) {
    local_38 = Global;
    pVar6 = std::make_pair<el::Level,bool_const&>(&local_38,(bool *)confMap_local);
    local_34.first = pVar6.first;
    local_34.second = pVar6.second;
    std::
    unordered_map<el::Level,bool,std::hash<el::Level>,std::equal_to<el::Level>,std::allocator<std::pair<el::Level_const,bool>>>
    ::insert<std::pair<el::Level,bool>>(puVar2,&local_34);
  }
  else {
    local_54 = Global;
    local_50._M_cur =
         (__node_type *)
         utils::std::
         unordered_map<el::Level,_bool,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
         ::find((unordered_map<el::Level,_bool,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
                 *)puStack_28,&local_54);
    local_60._M_cur =
         (__node_type *)
         utils::std::
         unordered_map<el::Level,_bool,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
         ::end((unordered_map<el::Level,_bool,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
                *)puStack_28);
    bVar4 = utils::std::__detail::operator!=(&local_50,&local_60);
    bVar3 = false;
    if (bVar4) {
      ppVar5 = utils::std::__detail::_Node_iterator<std::pair<const_el::Level,_bool>,_false,_true>::
               operator->((_Node_iterator<std::pair<const_el::Level,_bool>,_false,_true> *)&local_50
                         );
      bVar3 = (ppVar5->second & 1U) == (*(byte *)&(confMap_local->_M_h)._M_buckets & 1);
    }
    if (!bVar3) {
      local_68._M_cur =
           (__node_type *)
           utils::std::
           unordered_map<el::Level,_bool,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
           ::find((unordered_map<el::Level,_bool,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
                   *)puStack_28,(key_type *)((long)&value_local + 4));
      local_50._M_cur = local_68._M_cur;
      local_70._M_cur =
           (__node_type *)
           utils::std::
           unordered_map<el::Level,_bool,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
           ::end((unordered_map<el::Level,_bool,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
                  *)puStack_28);
      bVar3 = utils::std::__detail::operator==(&local_50,&local_70);
      puVar2 = puStack_28;
      if (bVar3) {
        pVar6 = std::make_pair<el::Level&,bool_const&>
                          ((Level *)((long)&value_local + 4),(bool *)confMap_local);
        local_78.first = pVar6.first;
        local_78.second = pVar6.second;
        std::
        unordered_map<el::Level,bool,std::hash<el::Level>,std::equal_to<el::Level>,std::allocator<std::pair<el::Level_const,bool>>>
        ::insert<std::pair<el::Level,bool>>(puVar2,&local_78);
      }
      else {
        bVar1 = *(byte *)&(confMap_local->_M_h)._M_buckets;
        pmVar7 = utils::std::
                 unordered_map<el::Level,_bool,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
                 ::at((unordered_map<el::Level,_bool,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
                       *)puStack_28,(key_type *)((long)&value_local + 4));
        *pmVar7 = (mapped_type)(bVar1 & 1);
      }
    }
  }
  return;
}

Assistant:

void setValue(Level level, const Conf_T& value, std::unordered_map<Level, Conf_T>* confMap,
                bool includeGlobalLevel = true) {
    // If map is empty and we are allowed to add into generic level (Level::Global), do it!
    if (confMap->empty() && includeGlobalLevel) {
      confMap->insert(std::make_pair(Level::Global, value));
      return;
    }
    // If same value exist in generic level already, dont add it to explicit level
    typename std::unordered_map<Level, Conf_T>::iterator it = confMap->find(Level::Global);
    if (it != confMap->end() && it->second == value) {
      return;
    }
    // Now make sure we dont double up values if we really need to add it to explicit level
    it = confMap->find(level);
    if (it == confMap->end()) {
      // Value not found for level, add new
      confMap->insert(std::make_pair(level, value));
    } else {
      // Value found, just update value
      confMap->at(level) = value;
    }
  }